

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  double *pdVar2;
  value_type vVar3;
  
  vVar3 = FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::dx
                    (&this->left_->fadexpr_,i);
  pFVar1 = this->right_;
  pdVar2 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar2 = (pFVar1->dx_).ptr_to_data + i;
  }
  return vVar3 + *pdVar2;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}